

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularQueue.hpp
# Opt level: O0

void __thiscall antlr::CircularQueue<int>::removeItems(CircularQueue<int> *this,size_t nb)

{
  CircularQueue<int> *pCVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  CircularQueue<int> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  CircularQueue<int> *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffd8;
  CircularQueue<int> *local_10;
  
  this_01 = in_RSI;
  pCVar1 = (CircularQueue<int> *)entries(in_RSI);
  local_10 = in_RSI;
  if (pCVar1 < this_01) {
    local_10 = (CircularQueue<int> *)entries(this_01);
  }
  if (in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start < (pointer)0x1388) {
    in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((long)&(local_10->storage).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                    (long)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  else {
    std::vector<int,_std::allocator<int>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_01,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    std::vector<int,_std::allocator<int>_>::begin(in_RDI);
    this_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(in_stack_ffffffffffffffb8,(difference_type)this_01);
    __last = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (in_stack_ffffffffffffffb8,(difference_type)this_01);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_01,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)this_00._M_current,in_stack_ffffffffffffffd8,
               (const_iterator)__last._M_current);
    in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
  }
  return;
}

Assistant:

inline void removeItems( size_t nb )
	{
		// it would be nice if we would not get called with nb > entries
		// (or to be precise when entries() == 0)
		// This case is possible when lexer/parser::recover() calls
		// consume+consumeUntil when the queue is empty.
		// In recover the consume says to prepare to read another
		// character/token. Then in the subsequent consumeUntil the
		// LA() call will trigger
		// syncConsume which calls this method *before* the same queue
		// has been sufficiently filled.
		if( nb > entries() )
			nb = entries();

		if (m_offset >= OFFSET_MAX_RESIZE)
		{
			storage.erase( storage.begin(), storage.begin() + m_offset + nb );
			m_offset = 0;
		}
		else
			m_offset += nb;
	}